

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3NodeFree(SegmentNode *pTree)

{
  SegmentNode *pSVar1;
  long in_RDI;
  SegmentNode *pRight;
  SegmentNode *p;
  SegmentNode *pTree_00;
  
  if (in_RDI != 0) {
    pTree_00 = *(SegmentNode **)(in_RDI + 0x10);
    fts3NodeFree(pTree_00);
    while (pTree_00 != (SegmentNode *)0x0) {
      pSVar1 = pTree_00->pRight;
      if ((SegmentNode *)pTree_00->aData != pTree_00 + 1) {
        sqlite3_free((void *)0x257326);
      }
      sqlite3_free((void *)0x257334);
      sqlite3_free((void *)0x25733e);
      pTree_00 = pSVar1;
    }
  }
  return;
}

Assistant:

static void fts3NodeFree(SegmentNode *pTree){
  if( pTree ){
    SegmentNode *p = pTree->pLeftmost;
    fts3NodeFree(p->pParent);
    while( p ){
      SegmentNode *pRight = p->pRight;
      if( p->aData!=(char *)&p[1] ){
        sqlite3_free(p->aData);
      }
      assert( pRight==0 || p->zMalloc==0 );
      sqlite3_free(p->zMalloc);
      sqlite3_free(p);
      p = pRight;
    }
  }
}